

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
           *this,element_type *p,arrays_type *arrays_,size_t *num_destroyed)

{
  uint64_t uVar1;
  
  uVar1 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this,
                     &p->first);
  nosize_transfer_element(this,p,uVar1,arrays_,num_destroyed);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, const arrays_type& arrays_,
                                 std::size_t& num_destroyed) {
        nosize_transfer_element(p, hash_for(key_from(*p)), arrays_, num_destroyed,
                                std::integral_constant < bool,
                                std::is_nothrow_move_constructible<init_type>::value ||
                                    !std::is_same<element_type, value_type>::value ||
                                    !std::is_copy_constructible<element_type>::value > {});
    }